

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

slist * gen_loadx_iphdrlen(compiler_state_t *cstate)

{
  slist *psVar1;
  slist *s2;
  slist *s;
  compiler_state_t *cstate_local;
  
  s2 = gen_abs_offset_varpart(cstate,&cstate->off_linkpl);
  if (s2 == (slist *)0x0) {
    s2 = new_stmt(cstate,0xb1);
    (s2->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl;
  }
  else {
    psVar1 = new_stmt(cstate,0x50);
    (psVar1->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl;
    sappend(s2,psVar1);
    psVar1 = new_stmt(cstate,0x54);
    (psVar1->s).k = 0xf;
    sappend(s2,psVar1);
    psVar1 = new_stmt(cstate,100);
    (psVar1->s).k = 2;
    sappend(s2,psVar1);
    psVar1 = new_stmt(cstate,0xc);
    sappend(s2,psVar1);
    psVar1 = new_stmt(cstate,7);
    sappend(s2,psVar1);
  }
  return s2;
}

Assistant:

static struct slist *
gen_loadx_iphdrlen(compiler_state_t *cstate)
{
	struct slist *s, *s2;

	s = gen_abs_offset_varpart(cstate, &cstate->off_linkpl);
	if (s != NULL) {
		/*
		 * The offset of the link-layer payload has a variable
		 * part.  "s" points to a list of statements that put
		 * the variable part of that offset into the X register.
		 *
		 * The 4*([k]&0xf) addressing mode can't be used, as we
		 * don't have a constant offset, so we have to load the
		 * value in question into the A register and add to it
		 * the value from the X register.
		 */
		s2 = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
		s2->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		sappend(s, s2);
		s2 = new_stmt(cstate, BPF_ALU|BPF_AND|BPF_K);
		s2->s.k = 0xf;
		sappend(s, s2);
		s2 = new_stmt(cstate, BPF_ALU|BPF_LSH|BPF_K);
		s2->s.k = 2;
		sappend(s, s2);

		/*
		 * The A register now contains the length of the IP header.
		 * We need to add to it the variable part of the offset of
		 * the link-layer payload, which is still in the X
		 * register, and move the result into the X register.
		 */
		sappend(s, new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_X));
		sappend(s, new_stmt(cstate, BPF_MISC|BPF_TAX));
	} else {
		/*
		 * The offset of the link-layer payload is a constant,
		 * so no code was generated to load the (non-existent)
		 * variable part of that offset.
		 *
		 * This means we can use the 4*([k]&0xf) addressing
		 * mode.  Load the length of the IPv4 header, which
		 * is at an offset of cstate->off_nl from the beginning of
		 * the link-layer payload, and thus at an offset of
		 * cstate->off_linkpl.constant_part + cstate->off_nl from the beginning
		 * of the raw packet data, using that addressing mode.
		 */
		s = new_stmt(cstate, BPF_LDX|BPF_MSH|BPF_B);
		s->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
	}
	return s;
}